

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputable.cpp
# Opt level: O0

uint32_t snestistics::instruction_size(uint8_t opcode,bool acc16,bool ind16)

{
  int iVar1;
  AdressModeInfo *ami;
  int am;
  bool ind16_local;
  bool acc16_local;
  uint8_t opcode_local;
  
  iVar1 = *(int *)(opCodeInfo + (ulong)opcode * 0x18 + 0x10);
  if ((iVar1 != 1) || (acc16)) {
    if ((iVar1 != 2) || (ind16)) {
      if ((iVar1 == 3) && ((opcode == '\0' || (opcode == '\x02')))) {
        am = 2;
      }
      else if ((iVar1 == 4) && ((branches[opcode] & 1) != 0)) {
        am = 2;
      }
      else {
        am = *(int *)(g_oplut + (long)iVar1 * 0x20 + 4);
      }
    }
    else {
      am = 2;
    }
  }
  else {
    am = 2;
  }
  return am;
}

Assistant:

uint32_t instruction_size(const uint8_t opcode, const bool acc16, const bool ind16) {
	const int am = opCodeInfo[opcode].adressMode;
	const AdressModeInfo &ami = g_oplut[am];

	// We have a few special cases that doesn't work with our simple table
	if (am == 1 && !acc16) {
		return 2;
	} else if (am == 2 && !ind16) {
		return 2;
	} else if (am == 3 && (opcode == 0 || opcode == 2)) {
		return 2;
	} else if (am == 4 && branches[opcode]) { // NOTE: BRL has am == 5
		return 2;
	} else {
		return ami.numBytes;
	}
}